

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O2

int crypto::pbkdf2<crypto::iterated_hash<crypto::sha256_transform>_>::derive
              (EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  uint uVar1;
  uint uVar2;
  size_t j;
  long lVar3;
  size_t in_RCX;
  ulong in_R8;
  void *in_R9;
  size_t i;
  ulong uVar4;
  size_t __n;
  ulong in_stack_00000008;
  void *local_140;
  char f [32];
  state_t istate;
  char u [32];
  state_t ostate;
  hmac_t mac;
  
  hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
            ((char *)ctx,(size_t)key,istate,ostate);
  uVar1 = 1;
  local_140 = in_R9;
  for (; in_stack_00000008 != 0; in_stack_00000008 = in_stack_00000008 - __n) {
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    f[0] = (char)uVar2;
    f[1] = (char)(uVar2 >> 8);
    f[2] = (char)(uVar2 >> 0x10);
    f[3] = (char)(uVar2 >> 0x18);
    mac.inner.count_lo = 0x40;
    mac.inner.count_hi = 0;
    mac.inner.state[4] = istate[4];
    mac.inner.state[5] = istate[5];
    mac.inner.state[6] = istate[6];
    mac.inner.state[7] = istate[7];
    mac.inner.state[0] = istate[0];
    mac.inner.state[1] = istate[1];
    mac.inner.state[2] = istate[2];
    mac.inner.state[3] = istate[3];
    iterated_hash<crypto::sha256_transform>::update(&mac.inner,(char *)keylen,in_RCX);
    iterated_hash<crypto::sha256_transform>::update(&mac.inner,f,4);
    hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
              ((hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)&mac.inner,ostate,u);
    f[0x10] = u[0x10];
    f[0x11] = u[0x11];
    f[0x12] = u[0x12];
    f[0x13] = u[0x13];
    f[0x14] = u[0x14];
    f[0x15] = u[0x15];
    f[0x16] = u[0x16];
    f[0x17] = u[0x17];
    f[0x18] = u[0x18];
    f[0x19] = u[0x19];
    f[0x1a] = u[0x1a];
    f[0x1b] = u[0x1b];
    f[0x1c] = u[0x1c];
    f[0x1d] = u[0x1d];
    f[0x1e] = u[0x1e];
    f[0x1f] = u[0x1f];
    f[0] = u[0];
    f[1] = u[1];
    f[2] = u[2];
    f[3] = u[3];
    f[4] = u[4];
    f[5] = u[5];
    f[6] = u[6];
    f[7] = u[7];
    f[8] = u[8];
    f[9] = u[9];
    f[10] = u[10];
    f[0xb] = u[0xb];
    f[0xc] = u[0xc];
    f[0xd] = u[0xd];
    f[0xe] = u[0xe];
    f[0xf] = u[0xf];
    for (uVar4 = 1; uVar4 < in_R8; uVar4 = uVar4 + 1) {
      mac.inner.count_lo = 0x40;
      mac.inner.count_hi = 0;
      mac.inner.state[4] = istate[4];
      mac.inner.state[5] = istate[5];
      mac.inner.state[6] = istate[6];
      mac.inner.state[7] = istate[7];
      mac.inner.state[0] = istate[0];
      mac.inner.state[1] = istate[1];
      mac.inner.state[2] = istate[2];
      mac.inner.state[3] = istate[3];
      iterated_hash<crypto::sha256_transform>::update(&mac.inner,u,0x20);
      hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
                ((hmac<crypto::iterated_hash<crypto::sha256_transform>_> *)&mac.inner,ostate,u);
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        f[lVar3] = f[lVar3] ^ u[lVar3];
      }
    }
    __n = 0x20;
    if (in_stack_00000008 < 0x20) {
      __n = in_stack_00000008;
    }
    memcpy(local_140,f,__n);
    local_140 = (void *)((long)local_140 + __n);
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

static void derive(const char * password, size_t password_length, const char * salt, size_t salt_length,
	                   size_t iterations, char * key, size_t key_length) {
		
		typename hmac_t::state_t istate, ostate;
		hmac_t::prepare_state(password, password_length, istate, ostate);
		
		for(size_t block = 1; key_length > 0; block++) {
			
			char u[hash_size];
			{
				char b[4] = { char(block >> 24), char(block >> 16), char(block >> 8), char(block) };
				hmac_t mac;
				mac.init(istate);
				mac.update(salt, salt_length);
				mac.update(b, sizeof(b));
				mac.finalize(ostate, u);
			}
			char f[hash_size];
			std::memcpy(f, u, hash_size);
			
			for(size_t i = 1; i < iterations; i++) {
				hmac_t mac;
				mac.init(istate);
				mac.update(u, hash_size);
				mac.finalize(ostate, u);
				for(size_t j = 0; j < hash_size; j++) {
					f[j] = char(boost::uint8_t(f[j]) ^ boost::uint8_t(u[j]));
				}
			}
			
			size_t n = std::min(size_t(hash_size), key_length);
			std::memcpy(key, f, n);
			key += n;
			key_length -= n;
		}
		
	}